

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gengetopt_main1.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer poVar1;
  pointer poVar2;
  pointer ppcVar3;
  int iVar4;
  ostream *poVar5;
  option_results *poVar6;
  long lVar7;
  char **file;
  pointer ppcVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<argagg::definition> __l_10;
  allocator_type local_80b;
  allocator local_80a;
  allocator_type local_809;
  allocator local_808;
  allocator local_807;
  allocator local_806;
  allocator_type local_805;
  allocator local_804;
  allocator local_803;
  allocator local_802;
  allocator_type local_801;
  allocator local_800;
  allocator local_7ff;
  allocator local_7fe;
  allocator_type local_7fd;
  allocator local_7fc;
  allocator local_7fb;
  allocator local_7fa;
  allocator_type local_7f9;
  allocator local_7f8;
  allocator local_7f7;
  allocator local_7f6;
  allocator local_7f5;
  allocator_type local_7f4;
  allocator local_7f3;
  allocator local_7f2;
  allocator local_7f1;
  allocator_type local_7f0;
  allocator local_7ef;
  allocator local_7ee;
  allocator local_7ed;
  allocator local_7ec;
  allocator_type local_7eb;
  allocator local_7ea;
  allocator local_7e9;
  allocator local_7e8;
  allocator local_7e7;
  allocator_type local_7e6;
  allocator local_7e5;
  allocator local_7e4;
  allocator local_7e3;
  allocator local_7e2;
  allocator_type local_7e1;
  allocator local_7e0;
  allocator local_7df;
  allocator local_7de;
  allocator local_7dd;
  allocator_type local_7dc;
  allocator local_7db;
  allocator local_7da;
  allocator local_7d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  string local_7b8 [32];
  parser_results args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  string local_720 [32];
  parser argparser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  string local_6c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  string local_5e8 [32];
  string flag_opt_arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5a8;
  string local_590 [32];
  uint local_570;
  string local_568 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_548;
  string local_530 [32];
  undefined4 local_510;
  string local_508 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e8;
  string local_4d0 [32];
  undefined4 local_4b0;
  string local_4a8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_488;
  string local_470 [32];
  undefined4 local_450;
  string local_448 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_428;
  string local_410 [32];
  undefined4 local_3f0;
  string local_3e8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c8;
  string local_3b0 [32];
  undefined4 local_390;
  string local_388 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  string local_350 [32];
  undefined4 local_330;
  string local_328 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_308;
  string local_2f0 [32];
  undefined4 local_2d0;
  string local_2c8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  string local_290 [32];
  undefined4 local_270;
  string local_268 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  string local_230 [32];
  undefined4 local_210;
  string local_208 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  string local_1d0 [32];
  undefined4 local_1b0;
  ostringstream usage;
  
  std::__cxx11::string::string((string *)&flag_opt_arg,"help",&local_7d9);
  std::__cxx11::string::string((string *)&usage,"-h",&local_7da);
  std::__cxx11::string::string
            ((string *)&usage.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20,"--help"
             ,&local_7db);
  __l._M_len = 2;
  __l._M_array = (iterator)&usage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_5a8,__l,&local_7dc);
  std::__cxx11::string::string(local_590,"Print help and exit",&local_7dd);
  local_570 = 0;
  std::__cxx11::string::string(local_568,"version",&local_7de);
  std::__cxx11::string::string((string *)&args,"-V",&local_7df);
  std::__cxx11::string::string((string *)&args.options._M_h._M_element_count,"--version",&local_7e0)
  ;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&args;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_548,__l_00,&local_7e1);
  std::__cxx11::string::string(local_530,"Print version and exit",&local_7e2);
  local_510 = 0;
  std::__cxx11::string::string(local_508,"str-opt",&local_7e3);
  std::__cxx11::string::string((string *)&local_7d8,"-s",&local_7e4);
  std::__cxx11::string::string(local_7b8,"--str-opt",&local_7e5);
  __l_01._M_len = 2;
  __l_01._M_array = &local_7d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_4e8,__l_01,&local_7e6);
  std::__cxx11::string::string(local_4d0,"A string option, for a filename",&local_7e7);
  local_4b0 = 1;
  std::__cxx11::string::string(local_4a8,"my-opt",&local_7e8);
  std::__cxx11::string::string((string *)&local_740,"-m",&local_7e9);
  std::__cxx11::string::string(local_720,"--my-opt",&local_7ea);
  __l_02._M_len = 2;
  __l_02._M_array = &local_740;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_488,__l_02,&local_7eb);
  std::__cxx11::string::string(local_470,"Another integer option",&local_7ec);
  local_450 = 1;
  std::__cxx11::string::string(local_448,"int-opt",&local_7ed);
  std::__cxx11::string::string((string *)&local_6e8,"-i",&local_7ee);
  std::__cxx11::string::string(local_6c8,"--int-opt",&local_7ef);
  __l_03._M_len = 2;
  __l_03._M_array = &local_6e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_428,__l_03,&local_7f0);
  std::__cxx11::string::string(local_410,"A int option",&local_7f1);
  local_3f0 = 1;
  std::__cxx11::string::string(local_3e8,"flag-opt",&local_7f2);
  std::__cxx11::string::string((string *)&local_6a8,"--flag-opt",&local_7f3);
  __l_04._M_len = 1;
  __l_04._M_array = &local_6a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3c8,__l_04,&local_7f4);
  std::__cxx11::string::string(local_3b0,"A flag option (default: off)",&local_7f5);
  local_390 = 0;
  std::__cxx11::string::string(local_388,"funct-opt",&local_7f6);
  std::__cxx11::string::string((string *)&local_608,"-F",&local_7f7);
  std::__cxx11::string::string(local_5e8,"--funct-opt",&local_7f8);
  __l_05._M_len = 2;
  __l_05._M_array = &local_608;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_368,__l_05,&local_7f9);
  std::__cxx11::string::string(local_350,"A function option",&local_7fa);
  local_330 = 0;
  std::__cxx11::string::string(local_328,"long-opt",&local_7fb);
  std::__cxx11::string::string((string *)&local_628,"--long-opt",&local_7fc);
  __l_06._M_len = 1;
  __l_06._M_array = &local_628;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_308,__l_06,&local_7fd);
  std::__cxx11::string::string(local_2f0,"A long option",&local_7fe);
  local_2d0 = 1;
  std::__cxx11::string::string(local_2c8,"def-opt",&local_7ff);
  std::__cxx11::string::string((string *)&local_648,"--def-opt",&local_800);
  __l_07._M_len = 1;
  __l_07._M_array = &local_648;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2a8,__l_07,&local_801);
  std::__cxx11::string::string
            (local_290,"A string option with default (default: \'Hello\')",&local_802);
  local_270 = 1;
  std::__cxx11::string::string(local_268,"enum-opt",&local_803);
  std::__cxx11::string::string((string *)&local_668,"--enum-opt",&local_804);
  __l_08._M_len = 1;
  __l_08._M_array = &local_668;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_248,__l_08,&local_805);
  std::__cxx11::string::string
            (local_230,
             "A string option with list of values (possible values=\"foo\", \"bar\", \"hello\", \"bye\"; default=\"hello\")"
             ,&local_806);
  local_210 = 1;
  std::__cxx11::string::string(local_208,"dependant",&local_807);
  std::__cxx11::string::string((string *)&local_688,"--dependant",&local_808);
  __l_09._M_len = 1;
  __l_09._M_array = &local_688;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1e8,__l_09,&local_809);
  std::__cxx11::string::string(local_1d0,"option that depends on str-opt",&local_80a);
  local_1b0 = 1;
  __l_10._M_len = 0xb;
  __l_10._M_array = (iterator)&flag_opt_arg;
  std::vector<argagg::definition,_std::allocator<argagg::definition>_>::vector
            (&argparser.definitions,__l_10,&local_80b);
  lVar7 = 0x3c0;
  do {
    argagg::definition::~definition((definition *)((long)&flag_opt_arg._M_dataplus._M_p + lVar7));
    lVar7 = lVar7 + -0x60;
  } while (lVar7 != -0x60);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_628);
  lVar7 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_608._M_dataplus._M_p + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  std::__cxx11::string::~string((string *)&local_6a8);
  lVar7 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_6e8._M_dataplus._M_p + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  lVar7 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_740._M_dataplus._M_p + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  lVar7 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_7d8._M_dataplus._M_p + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  lVar7 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&args.program + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  lVar7 = 0x20;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&usage.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
               + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  poVar5 = std::operator<<((ostream *)&std::cout,"This one is from a C++ program\n");
  poVar5 = std::operator<<(poVar5,"Try to launch me with some options\n");
  poVar5 = std::operator<<(poVar5,"(type ");
  poVar5 = std::operator<<(poVar5,*argv);
  poVar5 = std::operator<<(poVar5," --help for the complete list)\n");
  poVar5 = std::operator<<(poVar5,"For example: ");
  poVar5 = std::operator<<(poVar5,*argv);
  std::operator<<(poVar5," *.* --funct-opt\n");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&usage);
  poVar5 = std::operator<<(&usage.super_basic_ostream<char,_std::char_traits<char>_>,*argv);
  poVar5 = std::operator<<(poVar5," 2.0\n");
  poVar5 = std::operator<<(poVar5,'\n');
  poVar5 = std::operator<<(poVar5,"Usage: ");
  poVar5 = std::operator<<(poVar5,*argv);
  poVar5 = std::operator<<(poVar5," [OPTIONS]... [FILES]...\n");
  std::operator<<(poVar5,'\n');
  args.options._M_h._M_buckets = &args.options._M_h._M_single_bucket;
  args.options._M_h._M_bucket_count = 1;
  args.options._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  args.options._M_h._M_element_count = 0;
  args.options._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  args.options._M_h._M_rehash_policy._M_next_resize = 0;
  args.options._M_h._M_single_bucket = (__node_base_ptr)0x0;
  args.pos.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.pos.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  args.pos.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  argagg::parser::parse((parser_results *)&flag_opt_arg,&argparser,argc,argv);
  argagg::parser_results::operator=(&args,(parser_results *)&flag_opt_arg);
  argagg::parser_results::~parser_results((parser_results *)&flag_opt_arg);
  std::__cxx11::string::string((string *)&flag_opt_arg,"help",(allocator *)&local_7d8);
  poVar6 = argagg::parser_results::operator[](&args,&flag_opt_arg);
  poVar1 = (poVar6->all).
           super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>._M_impl
           .super__Vector_impl_data._M_finish;
  poVar2 = (poVar6->all).
           super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>._M_impl
           .super__Vector_impl_data._M_start;
  std::__cxx11::string::~string((string *)&flag_opt_arg);
  if (poVar1 == poVar2) {
    std::__cxx11::string::string((string *)&flag_opt_arg,"version",(allocator *)&local_7d8);
    poVar6 = argagg::parser_results::operator[](&args,&flag_opt_arg);
    poVar1 = (poVar6->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    poVar2 = (poVar6->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::~string((string *)&flag_opt_arg);
    if (poVar1 != poVar2) {
      iVar4 = 0;
      std::operator<<((ostream *)&std::cerr,"2.0\n");
      goto LAB_0010be6c;
    }
    std::__cxx11::string::string((string *)&flag_opt_arg,"int-opt",(allocator *)&local_7d8);
    poVar6 = argagg::parser_results::operator[](&args,&flag_opt_arg);
    poVar1 = (poVar6->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    poVar2 = (poVar6->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::~string((string *)&flag_opt_arg);
    if (poVar1 == poVar2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,args.program);
      std::operator<<(poVar5,": \'--int-opt\' (\'-i\') option required\n");
      iVar4 = 1;
      goto LAB_0010be6c;
    }
    std::operator<<((ostream *)&std::cout,"Here are the options you passed...\n");
    ppcVar3 = args.pos.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar8 = args.pos.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppcVar8 != ppcVar3; ppcVar8 = ppcVar8 + 1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"file: ");
      poVar5 = std::operator<<(poVar5,*ppcVar8);
      std::operator<<(poVar5,'\n');
    }
    std::__cxx11::string::string((string *)&flag_opt_arg,"funct-opt",(allocator *)&local_7d8);
    poVar6 = argagg::parser_results::operator[](&args,&flag_opt_arg);
    poVar1 = (poVar6->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    poVar2 = (poVar6->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::~string((string *)&flag_opt_arg);
    if (poVar1 != poVar2) {
      std::operator<<((ostream *)&std::cout,"You chose --funct-opt or -F.\n");
    }
    std::__cxx11::string::string((string *)&flag_opt_arg,"str-opt",(allocator *)&local_7d8);
    poVar6 = argagg::parser_results::operator[](&args,&flag_opt_arg);
    poVar1 = (poVar6->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    poVar2 = (poVar6->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::~string((string *)&flag_opt_arg);
    if (poVar1 != poVar2) {
      poVar5 = std::operator<<((ostream *)&std::cout,"You inserted ");
      std::__cxx11::string::string((string *)&local_7d8,"str-opt",(allocator *)&local_740);
      poVar6 = argagg::parser_results::operator[](&args,&local_7d8);
      argagg::option_results::as<std::__cxx11::string>(&flag_opt_arg,poVar6);
      poVar5 = std::operator<<(poVar5,(string *)&flag_opt_arg);
      poVar5 = std::operator<<(poVar5," for ");
      std::operator<<(poVar5,"--str-opt option.\n");
      std::__cxx11::string::~string((string *)&flag_opt_arg);
      std::__cxx11::string::~string((string *)&local_7d8);
    }
    std::__cxx11::string::string((string *)&flag_opt_arg,"int-opt",(allocator *)&local_7d8);
    poVar6 = argagg::parser_results::operator[](&args,&flag_opt_arg);
    poVar1 = (poVar6->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    poVar2 = (poVar6->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::~string((string *)&flag_opt_arg);
    if (poVar1 != poVar2) {
      poVar5 = std::operator<<((ostream *)&std::cout,"This is the integer you input: ");
      std::__cxx11::string::string((string *)&flag_opt_arg,"int-opt",(allocator *)&local_7d8);
      poVar6 = argagg::parser_results::operator[](&args,&flag_opt_arg);
      iVar4 = argagg::option_results::as<int>(poVar6);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
      std::operator<<(poVar5,".\n");
      std::__cxx11::string::~string((string *)&flag_opt_arg);
    }
    std::__cxx11::string::string((string *)&flag_opt_arg,"off",(allocator *)&local_7d8);
    std::__cxx11::string::string((string *)&local_7d8,"flag-opt",(allocator *)&local_740);
    poVar6 = argagg::parser_results::operator[](&args,&local_7d8);
    poVar1 = (poVar6->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    poVar2 = (poVar6->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::~string((string *)&local_7d8);
    if (poVar1 != poVar2) {
      std::operator<<((ostream *)&std::cout,"The flag option was given!\n");
      std::__cxx11::string::assign((char *)&flag_opt_arg);
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"The flag is ");
    poVar5 = std::operator<<(poVar5,(string *)&flag_opt_arg);
    std::operator<<(poVar5,".\n");
    std::__cxx11::string::string((string *)&local_7d8,"enum-opt",(allocator *)&local_740);
    poVar6 = argagg::parser_results::operator[](&args,&local_7d8);
    poVar1 = (poVar6->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    poVar2 = (poVar6->all).
             super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
             _M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::~string((string *)&local_7d8);
    if (poVar1 != poVar2) {
      poVar5 = std::operator<<((ostream *)&std::cout,"enum-opt value: ");
      std::__cxx11::string::string((string *)&local_740,"enum-opt",(allocator *)&local_6e8);
      poVar6 = argagg::parser_results::operator[](&args,&local_740);
      argagg::option_results::as<std::__cxx11::string>(&local_7d8,poVar6);
      poVar5 = std::operator<<(poVar5,(string *)&local_7d8);
      std::operator<<(poVar5,'\n');
      std::__cxx11::string::~string((string *)&local_7d8);
      std::__cxx11::string::~string((string *)&local_740);
      std::operator<<((ostream *)&std::cout,"enum-opt (original specified) value: hello\n");
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"def_opt: ");
    std::__cxx11::string::string((string *)&local_740,"def-opt",(allocator *)&local_608);
    poVar6 = argagg::parser_results::operator[](&args,&local_740);
    std::__cxx11::string::string((string *)&local_6e8,"Hello",(allocator *)&local_6a8);
    argagg::option_results::as<std::__cxx11::string>(&local_7d8,poVar6,&local_6e8);
    poVar5 = std::operator<<(poVar5,(string *)&local_7d8);
    std::operator<<(poVar5,"! ");
    std::__cxx11::string::~string((string *)&local_7d8);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::__cxx11::string::~string((string *)&local_740);
    std::operator<<((ostream *)&std::cout,"Have a nice day! :-)\n");
    std::__cxx11::string::~string((string *)&flag_opt_arg);
  }
  else {
    argagg::fmt_ostream::fmt_ostream((fmt_ostream *)&flag_opt_arg,(ostream *)&std::cerr);
    std::__cxx11::stringbuf::str();
    poVar5 = std::operator<<((ostream *)&flag_opt_arg,(string *)&local_7d8);
    operator<<(poVar5,&argparser);
    std::__cxx11::string::~string((string *)&local_7d8);
    argagg::fmt_ostream::~fmt_ostream((fmt_ostream *)&flag_opt_arg);
  }
  iVar4 = 0;
LAB_0010be6c:
  argagg::parser_results::~parser_results(&args);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&usage);
  std::vector<argagg::definition,_std::allocator<argagg::definition>_>::~vector
            (&argparser.definitions);
  return iVar4;
}

Assistant:

int main(int argc, char **argv)
{
  using argagg::parser_results;
  using argagg::parser;
  using std::cerr;
  using std::cout;
  using std::ofstream;
  using std::ostream;
  using std::ostringstream;
  using std::string;

  parser argparser {{
      {
        "help", {"-h", "--help"},
        "Print help and exit", 0},
      {
        "version", {"-V", "--version"},
        "Print version and exit", 0},
      {
        "str-opt", {"-s", "--str-opt"},
        "A string option, for a filename", 1},
      {
        "my-opt", {"-m", "--my-opt"},
        "Another integer option", 1},
      {
        "int-opt", {"-i", "--int-opt"},
        "A int option", 1},
      {
        "flag-opt", {"--flag-opt"},
        "A flag option (default: off)", 0},
      {
        "funct-opt", {"-F", "--funct-opt"},
        "A function option", 0},
      {
        "long-opt", {"--long-opt"},
        "A long option", 1},
      {
        "def-opt", {"--def-opt"},
        "A string option with default (default: 'Hello')", 1},
      {
        "enum-opt", {"--enum-opt"},
        "A string option with list of values (possible values=\"foo\", "
        "\"bar\", \"hello\", \"bye\"; default=\"hello\")", 1},
      {
        "dependant", {"--dependant"},
        "option that depends on str-opt", 1},
    }};

  cout
    << "This one is from a C++ program\n"
    << "Try to launch me with some options\n"
    << "(type " << argv[0] << " --help for the complete list)\n"
    << "For example: " << argv[0] << " *.* --funct-opt\n";

  // Define our usage text.
  ostringstream usage;
  usage
    << argv[0] << " 2.0\n"
    << '\n'
    << "Usage: " << argv[0] << " [OPTIONS]... [FILES]...\n"
    << '\n';

  // Use our argument parser to... parse the command line arguments. If there
  // are any problems then just spit out the usage and help text and exit.
  argagg::parser_results args;
  try {
    args = argparser.parse(argc, argv);
  } catch (const std::exception& e) {
    argagg::fmt_ostream fmt(cerr);
    fmt << usage.str() << argparser << '\n'
        << "Encountered exception while parsing arguments: " << e.what()
        << '\n';
    return EXIT_FAILURE;
  }

  // If the help flag was specified then spit out the usage and help text and
  // exit.
  if (args["help"]) {
    argagg::fmt_ostream fmt(cerr);
    fmt << usage.str() << argparser;
    return EXIT_SUCCESS;
  }

  if (args["version"]) {
    cerr << "2.0\n";
    return EXIT_SUCCESS;
  }

  if (!args["int-opt"]) {
    cerr << args.program << ": '--int-opt' ('-i') option required\n";
    return EXIT_FAILURE;
  }

  cout << "Here are the options you passed...\n";

  for (const auto& file : args.pos) {
    cout << "file: " << file << '\n';
  }

  if (args["funct-opt"]) {
    cout << "You chose --funct-opt or -F.\n";
  }

  if (args["str-opt"]) {
    cout << "You inserted " << args["str-opt"].as<std::string>() << " for " <<
      "--str-opt option.\n";
  }

  if (args["int-opt"]) {
    cout << "This is the integer you input: " << args["int-opt"].as<int>()
      << ".\n";
  }

  string flag_opt_arg = "off";
  if (args["flag-opt"]) {
    cout << "The flag option was given!\n";
    flag_opt_arg = "on";
  }
  cout << "The flag is " << flag_opt_arg << ".\n";

  if (args["enum-opt"]) {
    cout << "enum-opt value: " << args["enum-opt"].as<string>() << '\n';
    cout << "enum-opt (original specified) value: hello\n";
  }

  cout << "def_opt: " << args["def-opt"].as<string>("Hello") << "! ";

  cout << "Have a nice day! :-)\n";

  return EXIT_SUCCESS;
}